

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O0

uLong adler32_combine(uLong adler1,uLong adler2,long len2)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint rem;
  unsigned_long sum2;
  unsigned_long sum1;
  long len2_local;
  uLong adler2_local;
  uLong adler1_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = len2;
  uVar2 = SUB164(auVar1 % ZEXT816(0xfff1),0);
  sum1 = (adler2 & 0xffff) + 0xfff0 + (adler1 & 0xffff);
  sum2 = (((adler1 >> 0x10 & 0xffff) + (adler2 >> 0x10 & 0xffff) + 0xfff1) - (ulong)uVar2) +
         ((ulong)uVar2 * (adler1 & 0xffff)) % 0xfff1;
  if (0xfff1 < sum1) {
    sum1 = sum1 - 0xfff1;
  }
  if (0xfff1 < sum1) {
    sum1 = sum1 - 0xfff1;
  }
  if (0x1ffe2 < sum2) {
    sum2 = sum2 - 0x1ffe2;
  }
  if (0xfff1 < sum2) {
    sum2 = sum2 - 0xfff1;
  }
  return sum1 | sum2 << 0x10;
}

Assistant:

uLong ZEXPORT adler32_combine(adler1, adler2, len2)
    uLong adler1;
    uLong adler2;
    z_off_t len2;
{
    unsigned long sum1;
    unsigned long sum2;
    unsigned rem;

    /* the derivation of this formula is left as an exercise for the reader */
    rem = (unsigned)(len2 % BASE);
    sum1 = adler1 & 0xffff;
    sum2 = rem * sum1;
    MOD(sum2);
    sum1 += (adler2 & 0xffff) + BASE - 1;
    sum2 += ((adler1 >> 16) & 0xffff) + ((adler2 >> 16) & 0xffff) + BASE - rem;
    if (sum1 > BASE) sum1 -= BASE;
    if (sum1 > BASE) sum1 -= BASE;
    if (sum2 > (BASE << 1)) sum2 -= (BASE << 1);
    if (sum2 > BASE) sum2 -= BASE;
    return sum1 | (sum2 << 16);
}